

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O0

void __thiscall GibbsSamplerFromHDP::calculateLogLikelihood(GibbsSamplerFromHDP *this)

{
  reference pvVar1;
  reference this_00;
  reference this_01;
  reference pvVar2;
  ostream *this_02;
  double dVar3;
  uint local_78;
  uint local_74;
  int k;
  int i;
  int j;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  undefined1 local_30 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  probabilityMatrix;
  double logLikelihood;
  GibbsSamplerFromHDP *this_local;
  
  (*this->_vptr_GibbsSamplerFromHDP[8])(this,1);
  probabilityMatrix.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,&this->_thetaEx);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_60,&this->_phiEx);
  dot<double>((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_30,&local_48,&local_60);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_60);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  for (k = 0; (uint)k < this->_J; k = k + 1) {
    local_74 = 0;
    while( true ) {
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->_nj,(long)k);
      if (*pvVar1 <= local_74) break;
      for (local_78 = 0; local_78 < this->_K; local_78 = local_78 + 1) {
        this_00 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)local_30,(long)k);
        this_01 = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::operator[](&this->_xji,(long)k);
        pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (this_01,(long)(int)local_74);
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)*pvVar1);
        dVar3 = log(*pvVar2);
        probabilityMatrix.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(dVar3 + (double)probabilityMatrix.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      local_74 = local_74 + 1;
    }
  }
  this_02 = (ostream *)
            std::ostream::operator<<
                      ((ostream *)&std::cout,
                       (double)probabilityMatrix.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::push_back
            (&this->_logLikelihood,
             (value_type_conflict1 *)
             &probabilityMatrix.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_30);
  return;
}

Assistant:

void GibbsSamplerFromHDP::calculateLogLikelihood(){//{{{
    this->calculateExpectations(true);
    double logLikelihood = 0;
    vector<vector<double> > probabilityMatrix = dot(_thetaEx, _phiEx);
    for(int j=0; j<_J; j++){
        for(int i=0; i<_nj[j]; i++){
            for(int k=0; k<_K; k++){
                logLikelihood += log(probabilityMatrix[j][_xji[j][i]]);
            }
        }
    }
    cout<<logLikelihood<<endl;
    _logLikelihood.push_back(logLikelihood);
}